

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckDebugFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,bool isCollecting)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  BVIndex BVar5;
  undefined4 *puVar6;
  SmallHeapBlockBitVector *pSVar7;
  uint local_24;
  uint index;
  uint verifyFreeCount;
  FreeObject *freeObject;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSStack_10;
  bool isCollecting_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  _index = this->freeObjectList;
  freeObject._7_1_ = isCollecting;
  pSStack_10 = this;
  if (!isCollecting) {
    (*(this->super_HeapBlock)._vptr_HeapBlock[0x10])(this,&index);
  }
  local_24 = 0;
  do {
    if (_index == (FreeObject *)0x0) {
      pSVar7 = GetDebugFreeBitVector(this);
      BVar5 = BVStatic<256UL>::Count(pSVar7);
      if (BVar5 != local_24) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x700,"(this->GetDebugFreeBitVector()->Count() == verifyFreeCount)",
                           "this->GetDebugFreeBitVector()->Count() == verifyFreeCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (this->lastFreeCount < local_24) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x701,"(verifyFreeCount <= this->lastFreeCount)",
                           "verifyFreeCount <= this->lastFreeCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      return;
    }
    uVar4 = GetAddressIndex(this,_index);
    if (uVar4 == 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x6fb,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                         "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pSVar7 = GetDebugFreeBitVector(this);
    uVar4 = GetAddressBitIndex(_index);
    BVar3 = BVStatic<256UL>::Test(pSVar7,(uint)uVar4);
    if (BVar3 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x6fc,
                         "(this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject)))",
                         "this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject))");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    local_24 = local_24 + 1;
    _index = FreeObject::GetNext(_index);
  } while( true );
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::CheckDebugFreeBitVector(bool isCollecting)
{
    FreeObject * freeObject = this->freeObjectList;

    if (!isCollecting)
    {
        this->GetFreeObjectListOnAllocator(&freeObject);
    }

    uint verifyFreeCount = 0;
    while (freeObject != nullptr)
    {
        uint index = this->GetAddressIndex(freeObject);
        Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);
        Assert(this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject)));
        verifyFreeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == verifyFreeCount);
    Assert(verifyFreeCount <= this->lastFreeCount);
}